

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::xpath_node_set::_assign
          (xpath_node_set *this,const_iterator begin_,const_iterator end_,type_t type_)

{
  ulong uVar1;
  bad_alloc *this_00;
  undefined8 uVar2;
  undefined4 in_ECX;
  long in_RDX;
  void *in_RSI;
  undefined4 *in_RDI;
  xpath_node *storage;
  size_t size_;
  
  uVar1 = in_RDX - (long)in_RSI >> 4;
  if (uVar1 < 2) {
    this_00 = (bad_alloc *)(in_RDI + 2);
  }
  else {
    this_00 = (bad_alloc *)
              (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                        allocate)(uVar1 << 4);
  }
  if (this_00 == (bad_alloc *)0x0) {
    uVar2 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(uVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if (*(undefined4 **)(in_RDI + 6) != in_RDI + 2) {
    (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (*(undefined8 *)(in_RDI + 6));
  }
  if (uVar1 != 0) {
    memcpy(this_00,in_RSI,uVar1 << 4);
  }
  *(bad_alloc **)(in_RDI + 6) = this_00;
  *(bad_alloc **)(in_RDI + 8) = this_00 + uVar1 * 0x10;
  *in_RDI = in_ECX;
  return;
}

Assistant:

PUGI_IMPL_FN void xpath_node_set::_assign(const_iterator begin_, const_iterator end_, type_t type_)
	{
		assert(begin_ <= end_);

		size_t size_ = static_cast<size_t>(end_ - begin_);

		// use internal buffer for 0 or 1 elements, heap buffer otherwise
		xpath_node* storage = (size_ <= 1) ? _storage : static_cast<xpath_node*>(impl::xml_memory::allocate(size_ * sizeof(xpath_node)));

		if (!storage)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return;
		#else
			throw std::bad_alloc();
		#endif
		}

		// deallocate old buffer
		if (_begin != _storage)
			impl::xml_memory::deallocate(_begin);

		// size check is necessary because for begin_ = end_ = nullptr, memcpy is UB
		if (size_)
			memcpy(storage, begin_, size_ * sizeof(xpath_node));

		_begin = storage;
		_end = storage + size_;
		_type = type_;
	}